

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

BinarySection *
flatbuffers::anon_unknown_46::GenerateMissingSection
          (BinarySection *__return_storage_ptr__,uint64_t offset,uint64_t length,uint8_t *binary)

{
  bool bVar1;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_470;
  allocator<char> local_451;
  string local_450;
  BinaryRegionComment local_430;
  BinaryRegion local_3b8;
  allocator<char> local_311;
  string local_310;
  undefined1 local_2f0 [8];
  BinaryRegionComment comment;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_270;
  allocator<char> local_251;
  string local_250;
  BinaryRegionComment local_230;
  BinaryRegion local_1b8;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  BinaryRegionComment comment_1;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  uint8_t *binary_local;
  uint64_t length_local;
  uint64_t offset_local;
  
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
             &comment_1.index);
  bVar1 = IsNonZeroRegion(offset,length,binary);
  if (bVar1) {
    BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_b8);
    comment_1.status_message.field_2._8_4_ = 0;
    if (length < 8) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
      SetError((BinaryRegionComment *)local_b8,WARN_CORRUPTED_PADDING,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator(&local_111);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
      SetError((BinaryRegionComment *)local_b8,WARN_NO_REFERENCES,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
    BinaryRegionComment::BinaryRegionComment(&local_230,(BinaryRegionComment *)local_b8);
    MakeBinaryRegion(&local_1b8,offset,length,Unknown,length,0,&local_230);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::push_back
              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               &comment_1.index,&local_1b8);
    BinaryRegion::~BinaryRegion(&local_1b8);
    BinaryRegionComment::~BinaryRegionComment(&local_230);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"no known references",&local_251);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
              (&local_270,
               (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               &comment_1.index);
    MakeBinarySection(__return_storage_ptr__,&local_250,Unknown,&local_270);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_270);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
    comment.index._4_4_ = 1;
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_b8);
  }
  else {
    BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_2f0);
    comment.status_message.field_2._8_4_ = 4;
    if (7 < length) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"",&local_311);
      SetError((BinaryRegionComment *)local_2f0,WARN_PADDING_LENGTH,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator(&local_311);
    }
    BinaryRegionComment::BinaryRegionComment(&local_430,(BinaryRegionComment *)local_2f0);
    MakeBinaryRegion(&local_3b8,offset,length,Uint8,length,0,&local_430);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::push_back
              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               &comment_1.index,&local_3b8);
    BinaryRegion::~BinaryRegion(&local_3b8);
    BinaryRegionComment::~BinaryRegionComment(&local_430);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"",&local_451);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
              (&local_470,
               (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
               &comment_1.index);
    MakeBinarySection(__return_storage_ptr__,&local_450,Padding,&local_470);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_470);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    comment.index._4_4_ = 1;
    BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_2f0);
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
             &comment_1.index);
  return __return_storage_ptr__;
}

Assistant:

static BinarySection GenerateMissingSection(const uint64_t offset,
                                            const uint64_t length,
                                            const uint8_t *const binary) {
  std::vector<BinaryRegion> regions;

  // Check if the region is all zeros or not, as that can tell us if it is
  // padding or not.
  if (IsNonZeroRegion(offset, length, binary)) {
    // Some of the padding bytes are non-zero, so this might be an unknown
    // section of the binary.
    // TODO(dbaileychess): We could be a bit smarter with different sized
    // alignments. For now, the 8 byte check encompasses all the smaller
    // alignments.
    BinaryRegionComment comment;
    comment.type = BinaryRegionCommentType::Unknown;
    if (length >= 8) {
      SetError(comment, BinaryRegionStatus::WARN_NO_REFERENCES);
    } else {
      SetError(comment, BinaryRegionStatus::WARN_CORRUPTED_PADDING);
    }

    regions.push_back(MakeBinaryRegion(offset, length * sizeof(uint8_t),
                                       BinaryRegionType::Unknown, length, 0,
                                       comment));

    return MakeBinarySection("no known references", BinarySectionType::Unknown,
                             std::move(regions));
  }

  BinaryRegionComment comment;
  comment.type = BinaryRegionCommentType::Padding;
  if (length >= 8) {
    SetError(comment, BinaryRegionStatus::WARN_PADDING_LENGTH);
  }

  // This region is most likely padding.
  regions.push_back(MakeBinaryRegion(offset, length * sizeof(uint8_t),
                                     BinaryRegionType::Uint8, length, 0,
                                     comment));

  return MakeBinarySection("", BinarySectionType::Padding, std::move(regions));
}